

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::Map<long,double>::insert<google::protobuf::Map<long,double>::const_iterator>
          (Map<long,double> *this,const_iterator first,const_iterator last)

{
  value_type *key;
  double *pdVar1;
  iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair> local_68;
  double local_48;
  pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair>,_unsigned_long>
  local_40;
  
  local_68.node_ = first.it_.node_;
  local_68.m_ = first.it_.m_;
  local_68.bucket_index_ = first.it_.bucket_index_;
  if (first.it_.node_ != last.it_.node_) {
    do {
      Map<long,_double>::InnerMap::FindHelper
                (&local_40,*(InnerMap **)(this + 0x10),&(((local_68.node_)->kv).v_)->first,
                 (TreeIterator *)0x0);
      if (local_40.first.node_ == (Node *)0x0) {
        key = ((local_68.node_)->kv).v_;
        local_48 = key->second;
        pdVar1 = Map<long,_double>::operator[]((Map<long,_double> *)this,&key->first);
        *pdVar1 = local_48;
      }
      Map<long,_double>::InnerMap::
      iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair>::operator++(&local_68);
    } while (local_68.node_ != last.it_.node_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }